

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_influence.h
# Opt level: O2

void __thiscall
xray_re::_influence<unsigned_int,_float>::set
          (_influence<unsigned_int,_float> *this,size_t num_bones,uint16_t *bones,float *weights)

{
  uint *puVar1;
  ushort uVar2;
  long lVar3;
  bool bVar4;
  float fVar5;
  _bone_weight<unsigned_int,_float> bw;
  _bone_weight<unsigned_int,_float> local_30;
  
  fVar5 = 0.0;
  do {
    bVar4 = num_bones == 0;
    num_bones = num_bones - 1;
    if (bVar4) {
      reorder(this);
      return;
    }
    if (num_bones == 0) {
      local_30.weight = 1.0 - fVar5;
    }
    else {
      local_30.weight = *weights;
      weights = weights + 1;
      fVar5 = fVar5 + local_30.weight;
    }
    uVar2 = *bones;
    bones = bones + 1;
    local_30.bone = (uint)uVar2;
    lVar3 = 0;
    do {
      if ((ulong)(this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).count << 3
          == lVar3) {
        _svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>::push_back
                  (&this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>,&local_30);
        break;
      }
      puVar1 = (uint *)((long)&(this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>
                               ).array[0].bone + lVar3);
      lVar3 = lVar3 + 8;
    } while (*puVar1 != local_30.bone);
  } while( true );
}

Assistant:

void _influence<Tb, Tw>::set(size_t num_bones, const uint16_t* bones, const float* weights)
{
	for (float sum = 0, w; num_bones;) {
		if (--num_bones == 0) {
			w = 1.f - sum;
		} else {
			w = *weights++;
			sum += w;
		}
		_bone_weight<Tb, Tw> bw(*bones++, w);
		for (typename _influence<Tb, Tw>::iterator it = _influence<Tb, Tw>::begin(),
				last = _influence<Tb, Tw>::end(); it != last; ++it) {
			if (it->bone == bw.bone) {
#if 0
				if (!equivalent<Tw>(w, 0)) {
					msg("bone%u, w=%f", bw.bone, w);
				}
				xr_assert(equivalent<Tw>(w, 0));
#endif
				goto skip;
			}
		}
		push_back(bw);
skip:;
	}
	reorder();
}